

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::subtract<float>(image *this,ConstPtr *i1,ConstPtr *i2)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int height;
  int chans;
  int iVar5;
  ImageBase *pIVar6;
  invalid_argument *piVar7;
  TypedImageBase<float> *pTVar8;
  element_type *peVar9;
  float *pfVar10;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar11;
  int local_44;
  int i;
  int ic;
  int ih;
  int iw;
  ConstPtr *i2_local;
  ConstPtr *i1_local;
  Ptr *out;
  
  pIVar6 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)i1);
  iVar4 = ImageBase::width(pIVar6);
  pIVar6 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)i1);
  height = ImageBase::height(pIVar6);
  pIVar6 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)i1);
  chans = ImageBase::channels(pIVar6);
  bVar3 = std::operator==(i1,(nullptr_t)0x0);
  if ((!bVar3) && (bVar3 = std::operator==(i2,(nullptr_t)0x0), !bVar3)) {
    pIVar6 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)i2);
    iVar5 = ImageBase::width(pIVar6);
    if (iVar4 == iVar5) {
      pIVar6 = (ImageBase *)
               std::
               __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)i2);
      iVar5 = ImageBase::height(pIVar6);
      if (height == iVar5) {
        pIVar6 = (ImageBase *)
                 std::
                 __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)i2);
        iVar5 = ImageBase::channels(pIVar6);
        if (chans == iVar5) {
          Image<float>::create();
          pTVar8 = &std::
                    __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this)->super_TypedImageBase<float>;
          TypedImageBase<float>::allocate(pTVar8,iVar4,height,chans);
          local_44 = 0;
          while( true ) {
            pTVar8 = &std::
                      __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)i1)->super_TypedImageBase<float>;
            iVar4 = TypedImageBase<float>::get_value_amount(pTVar8);
            if (iVar4 <= local_44) break;
            peVar9 = std::
                     __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)i1);
            pfVar10 = Image<float>::at(peVar9,local_44);
            fVar1 = *pfVar10;
            peVar9 = std::
                     __shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)i2);
            pfVar10 = Image<float>::at(peVar9,local_44);
            fVar2 = *pfVar10;
            this_00 = std::
                      __shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<core::Image<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)this);
            pfVar10 = Image<float>::at(this_00,local_44);
            *pfVar10 = fVar1 - fVar2;
            local_44 = local_44 + 1;
          }
          PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = extraout_RDX._M_pi;
          PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)this;
          return (Ptr)PVar11.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
        }
      }
    }
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Image dimensions do not match");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar7,"Null image given");
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
subtract (typename Image<T>::ConstPtr i1, typename Image<T>::ConstPtr i2)
{
    int const iw = i1->width();
    int const ih = i1->height();
    int const ic = i1->channels();

    if (i1 == nullptr || i2 == nullptr)
        throw std::invalid_argument("Null image given");

    if (iw != i2->width() || ih != i2->height() || ic != i2->channels())
        throw std::invalid_argument("Image dimensions do not match");

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(iw, ih, ic);

    // FIXME: That needs speedup! STL algo with pointers.
    for (int i = 0; i < i1->get_value_amount(); ++i)
        out->at(i) = i1->at(i) - i2->at(i);

    return out;
}